

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O3

FT_Error FT_Set_Char_Size(FT_Face face,FT_F26Dot6 char_width,FT_F26Dot6 char_height,
                         FT_UInt horz_resolution,FT_UInt vert_resolution)

{
  FT_Error FVar1;
  FT_Size_RequestRec req;
  FT_Size_RequestRec_ local_20;
  
  local_20.height = char_height;
  if (char_height == 0) {
    local_20.height = char_width;
  }
  if (char_width == 0) {
    local_20.height = char_height;
    char_width = char_height;
  }
  local_20.vertResolution = vert_resolution;
  if (vert_resolution == 0) {
    local_20.vertResolution = horz_resolution;
  }
  if (horz_resolution == 0) {
    local_20.vertResolution = vert_resolution;
    horz_resolution = vert_resolution;
  }
  local_20.horiResolution = horz_resolution;
  if (horz_resolution == 0) {
    local_20.vertResolution = 0x48;
    local_20.horiResolution = 0x48;
  }
  if (local_20.height < 0x41) {
    local_20.height = 0x40;
  }
  if (char_width < 0x41) {
    char_width = 0x40;
  }
  local_20.type = FT_SIZE_REQUEST_TYPE_NOMINAL;
  local_20.width = char_width;
  FVar1 = FT_Request_Size(face,&local_20);
  return FVar1;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Set_Char_Size( FT_Face     face,
                    FT_F26Dot6  char_width,
                    FT_F26Dot6  char_height,
                    FT_UInt     horz_resolution,
                    FT_UInt     vert_resolution )
  {
    FT_Size_RequestRec  req;


    /* check of `face' delayed to `FT_Request_Size' */

    if ( !char_width )
      char_width = char_height;
    else if ( !char_height )
      char_height = char_width;

    if ( !horz_resolution )
      horz_resolution = vert_resolution;
    else if ( !vert_resolution )
      vert_resolution = horz_resolution;

    if ( char_width  < 1 * 64 )
      char_width  = 1 * 64;
    if ( char_height < 1 * 64 )
      char_height = 1 * 64;

    if ( !horz_resolution )
      horz_resolution = vert_resolution = 72;

    req.type           = FT_SIZE_REQUEST_TYPE_NOMINAL;
    req.width          = char_width;
    req.height         = char_height;
    req.horiResolution = horz_resolution;
    req.vertResolution = vert_resolution;

    return FT_Request_Size( face, &req );
  }